

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O2

Node * __thiscall
llbuild::ninja::Manifest::findNode(Manifest *this,StringRef workingDirectory,StringRef path0)

{
  bool bVar1;
  iterator iVar2;
  SmallVectorImpl<char> *tmp;
  Node *pNVar3;
  StringRef workingDirectory_00;
  StringRef Key;
  SmallString<256U> absPathTmp;
  SmallVector<char,_256U> local_130;
  
  tmp = (SmallVectorImpl<char> *)path0.Data;
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&local_130,(char *)tmp,
             (char *)((long)&(tmp->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX + path0.Length));
  workingDirectory_00.Length = (size_t)&local_130;
  workingDirectory_00.Data = (char *)workingDirectory.Length;
  bVar1 = normalize_path((Manifest *)workingDirectory.Data,workingDirectory_00,tmp);
  if (bVar1) {
    Key.Length._4_4_ = 0;
    Key._0_12_ = local_130.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._0_12_;
    iVar2 = llvm::StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator>::find(&this->nodes,Key);
    if (iVar2.
        super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
        .Ptr != (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
                 )((this->nodes).super_StringMapImpl.TheTable +
                  (this->nodes).super_StringMapImpl.NumBuckets)) {
      pNVar3 = *(Node **)(*(long *)iVar2.
                                   super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
                                   .Ptr + 8);
      goto LAB_0012ac9f;
    }
  }
  pNVar3 = (Node *)0x0;
LAB_0012ac9f:
  llvm::SmallVectorImpl<char>::~SmallVectorImpl(&local_130.super_SmallVectorImpl<char>);
  return pNVar3;
}

Assistant:

Node* Manifest::findNode(StringRef workingDirectory, StringRef path0) {
  SmallString<256> absPathTmp = path0;
  if (!normalize_path(workingDirectory, absPathTmp)) {
    return nullptr;
  }

  auto it = nodes.find(absPathTmp);
  if (it == nodes.end()) {
    return nullptr;
  }
  return it->second;
}